

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_tests.cpp
# Opt level: O3

void __thiscall
test::iu_NoFailureTest_x_iutest_x_Inform_Test::Body(iu_NoFailureTest_x_iutest_x_Inform_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestPartResultReporterInterface *pTVar2;
  int iVar3;
  Variable *pVVar4;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker_1;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  AssertionHelper local_208;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  local_1d8;
  undefined1 local_1b8 [16];
  TestPartResultReporterInterface *local_1a8;
  int local_19c;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
             *)local_1b8);
  iVar3 = local_19c;
  pTVar2 = local_1a8;
  local_1b8._8_8_ = &PTR__ReporterHolder_003a2e10;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = pTVar2;
  if (0 < iVar3) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    paVar1 = &local_208.m_part_result.super_iuCodeMessage.m_message.field_2;
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "\nExpected: ; doesn\'t generate new failure.\n  Actual: it does.","");
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x4e;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&local_1d8);
  memset((iu_global_format_stringstream *)local_1b8,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  paVar1 = &local_208.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Succeeded.\n","");
  local_208.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
  ;
  local_208.m_part_result.super_iuCodeMessage.m_line = 0x4f;
  local_208.m_part_result.super_iuCodeMessage._44_4_ = 0;
  iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  iVar3 = local_1d8.m_count;
  pTVar2 = local_1d8.m_holder.m_origin;
  local_1d8.m_holder._vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = pTVar2;
  if (0 < iVar3) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "\nExpected: ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 79, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed() doesn\'t generate new failure.\n  Actual: it does."
               ,"");
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x4f;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
             *)local_1b8);
  NoFatalFailureTest_Subroutine();
  local_1b8._8_8_ = &PTR__ReporterHolder_003a2e10;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = local_1a8;
  if (0 < local_19c) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "\nExpected: NoFatalFailureTest_Subroutine() doesn\'t generate new failure.\n  Actual: it does."
               ,"");
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x50;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&local_1d8);
  memset((iu_global_format_stringstream *)local_1b8,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Succeeded.\n","");
  local_208.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
  ;
  local_208.m_part_result.super_iuCodeMessage.m_line = 0x51;
  local_208.m_part_result.super_iuCodeMessage._44_4_ = 0;
  iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  local_1d8.m_holder._vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = local_1d8.m_holder.m_origin;
  if (0 < local_1d8.m_count) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "\nExpected: { ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 81, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed(); } doesn\'t generate new failure.\n  Actual: it does."
               ,"");
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x51;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

IUTEST(NoFailureTest, Inform)
{
    IUTEST_INFORM_NO_FAILURE(;);
    IUTEST_INFORM_NO_FAILURE(IUTEST_SUCCEED());
    IUTEST_INFORM_NO_FAILURE(NoFatalFailureTest_Subroutine());
    IUTEST_INFORM_NO_FAILURE({ IUTEST_SUCCEED(); });
}